

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  double dVar3;
  string local_7a0;
  string local_780;
  Price price;
  OrderQty orderQty;
  OrdType ordType;
  undefined1 local_658 [16];
  _Alloc_hider local_648;
  char local_638 [16];
  _Alloc_hider local_628;
  size_type local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  field_metrics local_608;
  undefined1 local_600 [16];
  _Alloc_hider local_5f0;
  char local_5e0 [16];
  _Alloc_hider local_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  field_metrics local_5b0;
  Account account;
  ClOrdID clOrdID;
  Side side;
  FieldBase local_4a0;
  FieldBase local_448;
  FieldBase local_3f0;
  FieldBase local_398;
  Symbol symbol;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport executionReport;
  
  FIX::StringField::StringField(&symbol.super_StringField,0x37);
  symbol.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159320;
  FIX::CharField::CharField(&side.super_CharField,0x36);
  side.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159358;
  FIX::CharField::CharField(&ordType.super_CharField,0x28);
  ordType.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001593c8;
  FIX::DoubleField::DoubleField(&orderQty.super_QtyField,0x26);
  orderQty.super_QtyField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159400;
  FIX::DoubleField::DoubleField(&price.super_PriceField,0x2c);
  price.super_PriceField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159470;
  FIX::StringField::StringField(&clOrdID.super_StringField,0xb);
  clOrdID.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001594a8
  ;
  FIX::StringField::StringField(&account.super_StringField,1);
  account.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001594e0
  ;
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_780,this);
    local_600._0_8_ = &PTR__FieldBase_001592c8;
    local_600._8_4_ = 0x25;
    local_5f0._M_p = local_5e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f0,local_780._M_dataplus._M_p,
               local_780._M_dataplus._M_p + local_780._M_string_length);
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0.m_length = 0;
    local_5b0.m_checksum = 0;
    local_600._0_8_ = &PTR__FieldBase_001595c0;
    genExecID_abi_cxx11_(&local_7a0,this);
    local_658._0_8_ = &PTR__FieldBase_001592c8;
    local_658._8_4_ = 0x11;
    local_648._M_p = local_638;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_648,local_7a0._M_dataplus._M_p,
               local_7a0._M_dataplus._M_p + local_7a0._M_string_length);
    local_628._M_p = (pointer)&local_618;
    local_620 = 0;
    local_618._M_local_buf[0] = '\0';
    local_608.m_length = 0;
    local_608.m_checksum = 0;
    local_658._0_8_ = &PTR__FieldBase_001595f8;
    FIX::CharField::CharField((CharField *)&local_398,0x14,'0');
    local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159630;
    FIX::CharField::CharField((CharField *)&local_3f0,0x96,'2');
    local_3f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159828;
    FIX::CharField::CharField((CharField *)&local_448,0x27,'2');
    local_448._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159668;
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_4a0,0x20,dVar3,0);
    local_4a0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001596a0;
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_1e0,0x1f,dVar3,0);
    local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001596d8;
    FIX::DoubleField::DoubleField((DoubleField *)&local_238,0x97,0.0,0);
    local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159860;
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_290,0xe,dVar3,0);
    local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159710;
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_2e8,6,dVar3,0);
    local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00159748;
    FIX41::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)local_600,(ExecID *)local_658,(ExecTransType *)&local_398
               ,(ExecType *)&local_3f0,(OrdStatus *)&local_448,&symbol,&side,
               (OrderQty *)&orderQty.super_QtyField,(LastShares *)&local_4a0,(LastPx *)&local_1e0,
               (LeavesQty *)&local_238,(CumQty *)&local_290,(AvgPx *)&local_2e8);
    FIX::FieldBase::~FieldBase(&local_2e8);
    FIX::FieldBase::~FieldBase(&local_290);
    FIX::FieldBase::~FieldBase(&local_238);
    FIX::FieldBase::~FieldBase(&local_1e0);
    FIX::FieldBase::~FieldBase(&local_4a0);
    FIX::FieldBase::~FieldBase(&local_448);
    FIX::FieldBase::~FieldBase(&local_3f0);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase((FieldBase *)local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldBase::~FieldBase((FieldBase *)local_600);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)&clOrdID,true);
    _Var2 = FIX::FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      ((FieldMap *)message,*(FieldBase **)(message + 8),
                       *(FieldBase **)(message + 0x10),
                       account.super_StringField.super_FieldBase.m_tag);
    if (_Var2._M_current != *(FieldBase **)(message + 0x10)) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  executionReport.super_Message._0_8_ = &executionReport.super_Message.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&executionReport,"");
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX41::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX41::ExecutionReport executionReport = FIX41::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(FIX::ExecType_FILL),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      symbol,
      side,
      orderQty,
      FIX::LastShares(orderQty),
      FIX::LastPx(price),
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}